

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  FieldType FVar1;
  Arena *pAVar2;
  uint uVar3;
  int iVar4;
  LogMessage *pLVar5;
  int *piVar6;
  uint *puVar7;
  long *plVar8;
  ulong uVar9;
  ulong *puVar10;
  unsigned_long *puVar11;
  undefined4 extraout_var;
  Type *pTVar12;
  undefined4 extraout_var_00;
  Type *pTVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  RepeatedField<unsigned_int> *pRVar17;
  RepeatedField<int> *pRVar18;
  RepeatedField<long> *pRVar19;
  RepeatedField<unsigned_long> *pRVar20;
  string *psVar21;
  int iVar22;
  LogFinisher LStack_99;
  LogMessage LStack_98;
  LogMessage LStack_60;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 1) == 0) {
      iVar22 = 0x1f;
      if ((number | 1U) != 0) {
        for (; (number | 1U) >> iVar22 == 0; iVar22 = iVar22 + -1) {
        }
      }
      if ((this->field_0xa & 0x10) == 0) {
        uVar3 = MessageLite::ByteSize((this->field_0).message_value);
      }
      else {
        uVar3 = (*((this->field_0).message_value)->_vptr_MessageLite[10])();
      }
      iVar4 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar14 = (ulong)(iVar22 * 9 + 0x49U >> 6) + 4 + (long)(int)uVar3 +
               (ulong)(iVar4 * 9 + 0x49U >> 6);
    }
    else {
      sVar14 = 0;
    }
    return sVar14;
  }
  if (this->is_repeated != true) {
    if ((this->field_0xa & 1) != 0) {
      return 0;
    }
    FVar1 = this->type;
    if ((byte)(FVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&LStack_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar5 = LogMessage::operator<<
                         (&LStack_60,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&LStack_98,pLVar5);
      LogMessage::~LogMessage(&LStack_60);
    }
    uVar3 = number * 8 + 1;
    iVar22 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    sVar14 = (ulong)(iVar22 * 9 + 0x49U >> 6) << (FVar1 == '\n');
    FVar1 = this->type;
    if ((byte)(FVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&LStack_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar5 = LogMessage::operator<<
                         (&LStack_98,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&LStack_99,pLVar5);
      LogMessage::~LogMessage(&LStack_98);
    }
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      return sVar14 + 8;
    case '\x02':
    case '\a':
    case '\x0f':
      return sVar14 + 4;
    case '\x03':
    case '\x04':
      uVar9 = (this->field_0).uint64_value;
      goto LAB_00350056;
    case '\x05':
    case '\x0e':
      uVar9 = (ulong)(uint)(this->field_0).int32_value;
      if ((this->field_0).int32_value < 0) {
        uVar9 = 10;
        goto LAB_003501c6;
      }
      break;
    case '\b':
      return sVar14 + 1;
    case '\t':
    case '\f':
      uVar9 = ((this->field_0).string_value)->_M_string_length;
      goto LAB_003501b4;
    case '\n':
      uVar9 = (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
                           arena_ + 0x60))();
      goto LAB_003501c6;
    case '\v':
      pAVar2 = (((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_;
      if ((this->field_0xa & 0x10) == 0) {
        uVar9 = (**(code **)(pAVar2 + 0x60))();
      }
      else {
        iVar22 = (**(code **)(pAVar2 + 0x50))();
        uVar9 = (ulong)iVar22;
      }
LAB_003501b4:
      sVar14 = sVar14 + uVar9;
      break;
    case '\r':
      uVar9 = (ulong)(this->field_0).uint32_value;
      break;
    case '\x11':
      uVar3 = (this->field_0).int32_value >> 0x1f ^ (this->field_0).int32_value * 2 | 1;
      iVar22 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar22 == 0; iVar22 = iVar22 + -1) {
        }
      }
      goto LAB_003501bd;
    case '\x12':
      uVar9 = (this->field_0).int64_value >> 0x3f ^ (this->field_0).int64_value * 2;
LAB_00350056:
      lVar15 = 0x3f;
      if ((uVar9 | 1) != 0) {
        for (; (uVar9 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      iVar22 = (int)lVar15;
      goto LAB_003501bd;
    default:
      return sVar14;
    }
    uVar3 = (uint)uVar9 | 1;
    iVar22 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
LAB_003501bd:
    uVar9 = (ulong)(iVar22 * 9 + 0x49U >> 6);
LAB_003501c6:
    return sVar14 + uVar9;
  }
  FVar1 = this->type;
  if (this->is_packed == true) {
    if ((byte)(FVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&LStack_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar5 = LogMessage::operator<<
                         (&LStack_98,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&LStack_60,pLVar5);
      LogMessage::~LogMessage(&LStack_98);
    }
    switch(FVar1) {
    case '\x01':
    case '\x06':
    case '\x10':
      uVar16 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 3;
      break;
    case '\x02':
    case '\a':
    case '\x0f':
      uVar16 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_ << 2;
      break;
    case '\x03':
      pRVar19 = (this->field_0).repeated_int64_value;
      iVar22 = 0;
      if (pRVar19->current_size_ < 1) goto switchD_0034f9c1_default;
      uVar16 = 0;
      do {
        puVar10 = (ulong *)RepeatedField<long>::Get(pRVar19,iVar22);
        lVar15 = 0x3f;
        if ((*puVar10 | 1) != 0) {
          for (; (*puVar10 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        uVar16 = uVar16 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar19 = (this->field_0).repeated_int64_value;
      } while (iVar22 < pRVar19->current_size_);
      break;
    case '\x04':
      pRVar20 = (this->field_0).repeated_uint64_value;
      iVar22 = 0;
      if (pRVar20->current_size_ < 1) goto switchD_0034f9c1_default;
      uVar16 = 0;
      do {
        puVar11 = RepeatedField<unsigned_long>::Get(pRVar20,iVar22);
        lVar15 = 0x3f;
        if ((*puVar11 | 1) != 0) {
          for (; (*puVar11 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        uVar16 = uVar16 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar20 = (this->field_0).repeated_uint64_value;
      } while (iVar22 < pRVar20->current_size_);
      break;
    case '\x05':
      pRVar18 = (this->field_0).repeated_int32_value;
      iVar22 = 0;
      if (pRVar18->current_size_ < 1) goto switchD_0034f9c1_default;
      uVar16 = 0;
      do {
        puVar7 = (uint *)RepeatedField<int>::Get(pRVar18,iVar22);
        if ((int)*puVar7 < 0) {
          uVar9 = 10;
        }
        else {
          uVar3 = *puVar7 | 1;
          iVar4 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar9 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        uVar16 = uVar16 + uVar9;
        iVar22 = iVar22 + 1;
        pRVar18 = (this->field_0).repeated_int32_value;
      } while (iVar22 < pRVar18->current_size_);
      break;
    case '\b':
      uVar16 = (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
      break;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&LStack_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x62d);
      pLVar5 = LogMessage::operator<<(&LStack_60,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&LStack_99,pLVar5);
      LogMessage::~LogMessage(&LStack_60);
    default:
switchD_0034f9c1_default:
      uVar16 = 0;
      break;
    case '\r':
      pRVar17 = (this->field_0).repeated_uint32_value;
      iVar22 = 0;
      if (pRVar17->current_size_ < 1) goto switchD_0034f9c1_default;
      uVar16 = 0;
      do {
        puVar7 = RepeatedField<unsigned_int>::Get(pRVar17,iVar22);
        iVar4 = 0x1f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar16 = uVar16 + (iVar4 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar17 = (this->field_0).repeated_uint32_value;
      } while (iVar22 < pRVar17->current_size_);
      break;
    case '\x0e':
      pRVar18 = (this->field_0).repeated_int32_value;
      iVar22 = 0;
      if (pRVar18->current_size_ < 1) goto switchD_0034f9c1_default;
      uVar16 = 0;
      do {
        puVar7 = (uint *)RepeatedField<int>::Get(pRVar18,iVar22);
        if ((int)*puVar7 < 0) {
          uVar9 = 10;
        }
        else {
          uVar3 = *puVar7 | 1;
          iVar4 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar9 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        uVar16 = uVar16 + uVar9;
        iVar22 = iVar22 + 1;
        pRVar18 = (this->field_0).repeated_int32_value;
      } while (iVar22 < pRVar18->current_size_);
      break;
    case '\x11':
      pRVar18 = (this->field_0).repeated_int32_value;
      iVar22 = 0;
      if (pRVar18->current_size_ < 1) goto switchD_0034f9c1_default;
      uVar16 = 0;
      do {
        piVar6 = RepeatedField<int>::Get(pRVar18,iVar22);
        uVar3 = *piVar6 >> 0x1f ^ *piVar6 * 2 | 1;
        iVar4 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        uVar16 = uVar16 + (iVar4 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar18 = (this->field_0).repeated_int32_value;
      } while (iVar22 < pRVar18->current_size_);
      break;
    case '\x12':
      pRVar19 = (this->field_0).repeated_int64_value;
      iVar22 = 0;
      if (pRVar19->current_size_ < 1) goto switchD_0034f9c1_default;
      uVar16 = 0;
      do {
        plVar8 = RepeatedField<long>::Get(pRVar19,iVar22);
        uVar9 = *plVar8 >> 0x3f ^ *plVar8 * 2 | 1;
        lVar15 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        uVar16 = uVar16 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar19 = (this->field_0).repeated_int64_value;
      } while (iVar22 < pRVar19->current_size_);
    }
    this->cached_size = (uint)uVar16;
    if (uVar16 == 0) {
switchD_0034fb01_default:
      return 0;
    }
    uVar3 = (uint)uVar16 | 1;
    iVar22 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    uVar9 = (ulong)(iVar22 * 9 + 0x49U >> 6);
    uVar3 = number * 8 + 3;
    iVar22 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar22 == 0; iVar22 = iVar22 + -1) {
      }
    }
    sVar14 = uVar16 + (iVar22 * 9 + 0x49U >> 6);
    goto LAB_003501c6;
  }
  if ((byte)(FVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&LStack_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x34);
    pLVar5 = LogMessage::operator<<
                       (&LStack_60,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&LStack_98,pLVar5);
    LogMessage::~LogMessage(&LStack_60);
  }
  uVar3 = number * 8 + 1;
  iVar22 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar22 == 0; iVar22 = iVar22 + -1) {
    }
  }
  lVar15 = (ulong)(iVar22 * 9 + 0x49U >> 6) << (FVar1 == '\n');
  FVar1 = this->type;
  if ((byte)(FVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&LStack_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x34);
    pLVar5 = LogMessage::operator<<
                       (&LStack_98,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&LStack_99,pLVar5);
    LogMessage::~LogMessage(&LStack_98);
  }
  switch(FVar1) {
  case '\x01':
  case '\x06':
  case '\x10':
    lVar15 = lVar15 + 8;
    goto LAB_0034ffa4;
  case '\x02':
  case '\a':
  case '\x0f':
    lVar15 = lVar15 + 4;
    goto LAB_0034ffa4;
  case '\x03':
    pRVar19 = (this->field_0).repeated_int64_value;
    sVar14 = lVar15 * (ulong)(uint)pRVar19->current_size_;
    if (0 < pRVar19->current_size_) {
      iVar22 = 0;
      do {
        puVar10 = (ulong *)RepeatedField<long>::Get(pRVar19,iVar22);
        lVar15 = 0x3f;
        if ((*puVar10 | 1) != 0) {
          for (; (*puVar10 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar19 = (this->field_0).repeated_int64_value;
      } while (iVar22 < pRVar19->current_size_);
    }
    break;
  case '\x04':
    pRVar20 = (this->field_0).repeated_uint64_value;
    sVar14 = lVar15 * (ulong)(uint)pRVar20->current_size_;
    if (0 < pRVar20->current_size_) {
      iVar22 = 0;
      do {
        puVar11 = RepeatedField<unsigned_long>::Get(pRVar20,iVar22);
        lVar15 = 0x3f;
        if ((*puVar11 | 1) != 0) {
          for (; (*puVar11 | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar20 = (this->field_0).repeated_uint64_value;
      } while (iVar22 < pRVar20->current_size_);
    }
    break;
  case '\x05':
    pRVar18 = (this->field_0).repeated_int32_value;
    sVar14 = lVar15 * (ulong)(uint)pRVar18->current_size_;
    if (0 < pRVar18->current_size_) {
      iVar22 = 0;
      do {
        puVar7 = (uint *)RepeatedField<int>::Get(pRVar18,iVar22);
        if ((int)*puVar7 < 0) {
          uVar9 = 10;
        }
        else {
          uVar3 = *puVar7 | 1;
          iVar4 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar9 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        sVar14 = sVar14 + uVar9;
        iVar22 = iVar22 + 1;
        pRVar18 = (this->field_0).repeated_int32_value;
      } while (iVar22 < pRVar18->current_size_);
    }
    break;
  case '\b':
    lVar15 = lVar15 + 1;
LAB_0034ffa4:
    sVar14 = lVar15 * (ulong)(uint)((this->field_0).repeated_int32_value)->current_size_;
    break;
  case '\t':
    psVar21 = (this->field_0).string_value;
    uVar3 = (uint)psVar21->_M_string_length;
    sVar14 = lVar15 * (ulong)uVar3;
    if (0 < (int)uVar3) {
      iVar22 = 0;
      do {
        pTVar13 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar21,iVar22);
        uVar3 = (uint)pTVar13->_M_string_length | 1;
        iVar4 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + pTVar13->_M_string_length + (ulong)(iVar4 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        psVar21 = (this->field_0).string_value;
      } while (iVar22 < (int)psVar21->_M_string_length);
    }
    break;
  case '\n':
    psVar21 = (this->field_0).string_value;
    uVar3 = (uint)psVar21->_M_string_length;
    sVar14 = lVar15 * (ulong)uVar3;
    if (0 < (int)uVar3) {
      iVar22 = 0;
      do {
        pTVar12 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar21,iVar22);
        iVar4 = (*pTVar12->_vptr_MessageLite[0xc])(pTVar12);
        sVar14 = sVar14 + CONCAT44(extraout_var,iVar4);
        iVar22 = iVar22 + 1;
        psVar21 = (this->field_0).string_value;
      } while (iVar22 < (int)psVar21->_M_string_length);
    }
    break;
  case '\v':
    psVar21 = (this->field_0).string_value;
    uVar3 = (uint)psVar21->_M_string_length;
    sVar14 = lVar15 * (ulong)uVar3;
    if (0 < (int)uVar3) {
      iVar22 = 0;
      do {
        pTVar12 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar21,iVar22);
        uVar3 = (*pTVar12->_vptr_MessageLite[0xc])(pTVar12);
        iVar4 = 0x1f;
        if ((uVar3 | 1) != 0) {
          for (; (uVar3 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + CONCAT44(extraout_var_00,uVar3) + (ulong)(iVar4 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        psVar21 = (this->field_0).string_value;
      } while (iVar22 < (int)psVar21->_M_string_length);
    }
    break;
  case '\f':
    psVar21 = (this->field_0).string_value;
    uVar3 = (uint)psVar21->_M_string_length;
    sVar14 = lVar15 * (ulong)uVar3;
    if (0 < (int)uVar3) {
      iVar22 = 0;
      do {
        pTVar13 = RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            ((RepeatedPtrFieldBase *)psVar21,iVar22);
        uVar3 = (uint)pTVar13->_M_string_length | 1;
        iVar4 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + pTVar13->_M_string_length + (ulong)(iVar4 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        psVar21 = (this->field_0).string_value;
      } while (iVar22 < (int)psVar21->_M_string_length);
    }
    break;
  case '\r':
    pRVar17 = (this->field_0).repeated_uint32_value;
    sVar14 = lVar15 * (ulong)(uint)pRVar17->current_size_;
    if (0 < pRVar17->current_size_) {
      iVar22 = 0;
      do {
        puVar7 = RepeatedField<unsigned_int>::Get(pRVar17,iVar22);
        iVar4 = 0x1f;
        if ((*puVar7 | 1) != 0) {
          for (; (*puVar7 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + (iVar4 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar17 = (this->field_0).repeated_uint32_value;
      } while (iVar22 < pRVar17->current_size_);
    }
    break;
  case '\x0e':
    pRVar18 = (this->field_0).repeated_int32_value;
    sVar14 = lVar15 * (ulong)(uint)pRVar18->current_size_;
    if (0 < pRVar18->current_size_) {
      iVar22 = 0;
      do {
        puVar7 = (uint *)RepeatedField<int>::Get(pRVar18,iVar22);
        if ((int)*puVar7 < 0) {
          uVar9 = 10;
        }
        else {
          uVar3 = *puVar7 | 1;
          iVar4 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          uVar9 = (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        sVar14 = sVar14 + uVar9;
        iVar22 = iVar22 + 1;
        pRVar18 = (this->field_0).repeated_int32_value;
      } while (iVar22 < pRVar18->current_size_);
    }
    break;
  case '\x11':
    pRVar18 = (this->field_0).repeated_int32_value;
    sVar14 = lVar15 * (ulong)(uint)pRVar18->current_size_;
    if (0 < pRVar18->current_size_) {
      iVar22 = 0;
      do {
        piVar6 = RepeatedField<int>::Get(pRVar18,iVar22);
        uVar3 = *piVar6 >> 0x1f ^ *piVar6 * 2 | 1;
        iVar4 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar14 = sVar14 + (iVar4 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar18 = (this->field_0).repeated_int32_value;
      } while (iVar22 < pRVar18->current_size_);
    }
    break;
  case '\x12':
    pRVar19 = (this->field_0).repeated_int64_value;
    sVar14 = lVar15 * (ulong)(uint)pRVar19->current_size_;
    if (0 < pRVar19->current_size_) {
      iVar22 = 0;
      do {
        plVar8 = RepeatedField<long>::Get(pRVar19,iVar22);
        uVar9 = *plVar8 >> 0x3f ^ *plVar8 * 2 | 1;
        lVar15 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar15 == 0; lVar15 = lVar15 + -1) {
          }
        }
        sVar14 = sVar14 + ((int)lVar15 * 9 + 0x49U >> 6);
        iVar22 = iVar22 + 1;
        pRVar19 = (this->field_0).repeated_int64_value;
      } while (iVar22 < pRVar19->current_size_);
    }
    break;
  default:
    goto switchD_0034fb01_default;
  }
  return sVar14;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  size_t message_size = 0;
  if (is_lazy) {
    message_size = lazymessage_value->ByteSize();
  } else {
    message_size = message_value->ByteSize();
  }

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}